

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2espec.cc
# Opt level: O0

void rm_storage_fs(void)

{
  char cmd [64];
  int r;
  char acStack_48 [68];
  int local_4;
  
  sprintf(acStack_48,"rm -rf  %s*>errorlog.txt","e2edb_main");
  local_4 = system(acStack_48);
  sprintf(acStack_48,"rm -rf  %s*>errorlog.txt","e2edb_records");
  system(acStack_48);
  return;
}

Assistant:

void rm_storage_fs()
{
    // remove previous dummy files
    int r;
    char cmd[64];

    sprintf(cmd, SHELL_DEL" %s*>errorlog.txt", E2EDB_MAIN);
    r = system(cmd);
    (void)r;

    sprintf(cmd, SHELL_DEL" %s*>errorlog.txt", E2EDB_RECORDS);
    r = system(cmd);
    (void)r;
}